

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_google::protobuf::Map<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&> *
__thiscall
testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_google::protobuf::Map<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
           *__return_storage_ptr__,ElementsAreMatcher *this)

{
  back_insert_iterator<std::vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>_>
  bVar1;
  ElementsAreMatcherImpl<google::protobuf::Map<unsigned_long,proto2_unittest::Proto2MapEnumPlusExtra>const&>
  *this_00;
  iterator first;
  iterator last;
  undefined1 local_30 [8];
  MatcherVec matchers;
  ElementsAreMatcher<std::tuple<testing::internal::PairMatcher<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_>_>
  *this_local;
  
  matchers.
  super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
  ::vector((vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
            *)local_30);
  std::
  vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
  ::reserve((vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
             *)local_30,1);
  bVar1 = std::
          back_inserter<std::vector<testing::Matcher<std::pair<unsigned_long_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>,std::allocator<testing::Matcher<std::pair<unsigned_long_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>>>
                    ((vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                      *)local_30);
  TransformTupleValues<std::tuple<testing::internal::PairMatcher<unsigned_long,proto2_unittest::Proto2MapEnumPlusExtra>>,testing::internal::CastAndAppendTransform<std::pair<unsigned_long_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>,std::back_insert_iterator<std::vector<testing::Matcher<std::pair<unsigned_long_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>,std::allocator<testing::Matcher<std::pair<unsigned_long_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>>>>
            (this,bVar1.container);
  this_00 = (ElementsAreMatcherImpl<google::protobuf::Map<unsigned_long,proto2_unittest::Proto2MapEnumPlusExtra>const&>
             *)operator_new(0x20);
  first = std::
          vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
          ::begin((vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                   *)local_30);
  last = std::
         vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
         ::end((vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                *)local_30);
  ElementsAreMatcherImpl<google::protobuf::Map<unsigned_long,proto2_unittest::Proto2MapEnumPlusExtra>const&>
  ::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::pair<unsigned_long_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>*,std::vector<testing::Matcher<std::pair<unsigned_long_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>,std::allocator<testing::Matcher<std::pair<unsigned_long_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>>>>
            (this_00,(__normal_iterator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>_>
                      )first._M_current,
             (__normal_iterator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>_>
              )last._M_current);
  Matcher<const_google::protobuf::Map<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>::
  Matcher(__return_storage_ptr__,
          (MatcherInterface<const_google::protobuf::Map<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
           *)this_00);
  std::
  vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
  ::~vector((vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    static_assert(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value ||
            ::std::tuple_size<MatcherTuple>::value < 2,
        "use UnorderedElementsAre with hash tables");

    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&>> MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers.begin(), matchers.end()));
  }